

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

void prvTidyFreeAttrs(TidyDocImpl *doc,Node *node)

{
  TidyAttrId TVar1;
  AttVal *av_00;
  Bool BVar2;
  AttVal *av;
  
  av_00 = node->attributes;
  while (av_00 != (AttVal *)0x0) {
    if ((((av_00->attribute != (tmbstr)0x0) && (av_00->dict != (Attribute *)0x0)) &&
        ((TVar1 = av_00->dict->id, TVar1 == TidyAttr_NAME || (TVar1 == TidyAttr_ID)))) &&
       (BVar2 = prvTidyIsAnchorElement(doc,node), BVar2 != no)) {
      prvTidyRemoveAnchorByNode(doc,av_00->value,node);
    }
    node->attributes = av_00->next;
    prvTidyFreeAttribute(doc,av_00);
    av_00 = node->attributes;
  }
  return;
}

Assistant:

void TY_(FreeAttrs)( TidyDocImpl* doc, Node *node )
{
    while ( node->attributes )
    {
        AttVal *av = node->attributes;

        if ( av->attribute )
        {
            if ( (attrIsID(av) || attrIsNAME(av)) &&
                 TY_(IsAnchorElement)(doc, node) )
            {
                TY_(RemoveAnchorByNode)( doc, av->value, node );
            }
        }

        node->attributes = av->next;
        TY_(FreeAttribute)( doc, av );
    }
}